

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDataQueue.h
# Opt level: O0

VRDataIndex * __thiscall MinVR::VRDataQueueItem::getData(VRDataQueueItem *this)

{
  long *in_RSI;
  VRDataIndex *in_RDI;
  VRDataIndex *in_stack_00000018;
  VRDataIndex *in_stack_00000020;
  string *in_stack_000000e8;
  VRDataIndex *in_stack_000000f0;
  string local_30 [48];
  
  if (*in_RSI == 0) {
    std::__cxx11::string::string(local_30,(string *)(in_RSI + 1));
    VRDataIndex::VRDataIndex(in_stack_000000f0,in_stack_000000e8);
    std::__cxx11::string::~string(local_30);
  }
  else {
    VRDataIndex::VRDataIndex(in_stack_00000020,in_stack_00000018);
  }
  return in_RDI;
}

Assistant:

VRDataIndex getData() const {
    if (_dataIndex) {
      return *_dataIndex;
    } else {
      return VRDataIndex(_serialData);
    }
  }